

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

download_priority_t __thiscall
libtorrent::aux::torrent::piece_priority(torrent *this,piece_index_t index)

{
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> this_00;
  download_priority_t dVar1;
  
  this_00._M_head_impl =
       (this->super_torrent_hot_members).m_picker._M_t.
       super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
       ._M_t.
       super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
       .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl;
  if (this_00._M_head_impl == (piece_picker *)0x0) {
    return (download_priority_t)'\x04';
  }
  if ((-1 < index.m_val) &&
     (index.m_val <
      (((this->super_torrent_hot_members).m_torrent_file.
        super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_files).
      m_num_pieces)) {
    dVar1 = piece_picker::piece_priority(this_00._M_head_impl,index);
    return (download_priority_t)dVar1.m_val;
  }
  return (download_priority_t)'\0';
}

Assistant:

download_priority_t torrent::piece_priority(piece_index_t const index) const
	{
//		INVARIANT_CHECK;

		if (!has_picker()) return default_priority;

		// this call is only valid on torrents with metadata
		TORRENT_ASSERT(valid_metadata());
		if (index < piece_index_t(0) || index >= m_torrent_file->end_piece())
		{
			TORRENT_ASSERT_FAIL();
			return dont_download;
		}

		return m_picker->piece_priority(index);
	}